

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QString * __thiscall QDir::relativeFilePath(QDir *this,QString *fileName)

{
  QStringView rhs;
  QChar c;
  QStringView lhs;
  QStringView v;
  QLatin1StringView other;
  bool bVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QString *result;
  anon_class_1_0_00000001 eq;
  iterator fit;
  iterator dit;
  sentinel fend;
  sentinel dend;
  QString file;
  QString dir;
  TokenizerResult<const_QString_&,_char16_t> fileElts;
  TokenizerResult<const_QString_&,_char16_t> dirElts;
  anon_class_1_0_00000001 *in_stack_fffffffffffffdd8;
  iterator *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined2 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  iterator *in_stack_fffffffffffffdf0;
  QStringView *in_stack_fffffffffffffdf8;
  bool local_1fb;
  QString *this_00;
  qsizetype in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  QChar local_182 [29];
  QStringTokenizerBase<QStringView,_QChar> *local_148;
  storage_type_conflict *psStack_140;
  QStringTokenizerBase<QStringView,_QChar> *local_138;
  storage_type_conflict *psStack_130;
  qsizetype local_128;
  storage_type_conflict *psStack_120;
  undefined1 local_111;
  undefined1 local_110 [56];
  undefined1 local_d8 [58];
  undefined1 local_9e;
  undefined1 local_9d;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  absolutePath((QDir *)CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT24(in_stack_fffffffffffffdec,
                                                  in_stack_fffffffffffffde8))));
  cleanPath((QString *)in_stack_fffffffffffffdf8);
  QString::~QString((QString *)0x27dcbd);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  cleanPath((QString *)in_stack_fffffffffffffdf8);
  bVar1 = isRelativePath((QString *)in_stack_fffffffffffffdf0);
  if ((bVar1) || (bVar1 = isRelativePath((QString *)in_stack_fffffffffffffdf0), bVar1)) {
    QString::QString((QString *)in_stack_fffffffffffffde0,(QString *)in_stack_fffffffffffffdd8);
  }
  else {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x27ddd8);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_9a = 0x2f;
    QString::tokenize<char16_t,Qt::SplitBehaviorFlags>
              ((QString *)in_stack_fffffffffffffdf8,(char16_t *)in_stack_fffffffffffffdf0,
               CONCAT13(in_stack_fffffffffffffdef,
                        CONCAT12(in_stack_fffffffffffffdee,in_stack_fffffffffffffdec)));
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_9c = 0x2f;
    QString::tokenize<char16_t,Qt::SplitBehaviorFlags>
              ((QString *)in_stack_fffffffffffffdf8,(char16_t *)in_stack_fffffffffffffdf0,
               CONCAT13(in_stack_fffffffffffffdef,
                        CONCAT12(in_stack_fffffffffffffdee,in_stack_fffffffffffffdec)));
    local_9d = 0xaa;
    local_9e = 0xaa;
    memset(local_d8,0xaa,0x38);
    QStringTokenizerBase<QStringView,_QChar>::begin
              ((QStringTokenizerBase<QStringView,_QChar> *)in_stack_fffffffffffffde0);
    memset(local_110,0xaa,0x38);
    QStringTokenizerBase<QStringView,_QChar>::begin
              ((QStringTokenizerBase<QStringView,_QChar> *)in_stack_fffffffffffffde0);
    local_111 = 0xaa;
    while( true ) {
      bVar1 = ::operator!=(local_d8);
      local_1fb = false;
      if (bVar1) {
        bVar1 = ::operator!=(local_110);
        local_1fb = false;
        if (bVar1) {
          in_stack_fffffffffffffdf8 =
               QStringTokenizerBase<QStringView,_QChar>::iterator::operator*((iterator *)0x27df72);
          local_128 = in_stack_fffffffffffffdf8->m_size;
          psStack_120 = in_stack_fffffffffffffdf8->m_data;
          in_stack_fffffffffffffdf0 =
               (iterator *)
               QStringTokenizerBase<QStringView,_QChar>::iterator::operator*((iterator *)0x27df96);
          local_138 = in_stack_fffffffffffffdf0->tokenizer;
          psStack_130 = (storage_type_conflict *)(in_stack_fffffffffffffdf0->current).value.m_size;
          lhs.m_data = (storage_type_conflict *)in_stack_fffffffffffffdf8;
          lhs.m_size = (qsizetype)in_stack_fffffffffffffdf0;
          rhs.m_data._0_4_ = in_stack_fffffffffffffde8;
          rhs.m_size = (qsizetype)in_stack_fffffffffffffde0;
          rhs.m_data._4_2_ = in_stack_fffffffffffffdec;
          rhs.m_data._6_1_ = in_stack_fffffffffffffdee;
          rhs.m_data._7_1_ = in_stack_fffffffffffffdef;
          in_stack_fffffffffffffdef =
               relativeFilePath::anon_class_1_0_00000001::operator()
                         (in_stack_fffffffffffffdd8,lhs,rhs);
          local_1fb = (bool)in_stack_fffffffffffffdef;
        }
      }
      if (local_1fb == false) break;
      QStringTokenizerBase<QStringView,_QChar>::iterator::operator++(in_stack_fffffffffffffde0);
      QStringTokenizerBase<QStringView,_QChar>::iterator::operator++(in_stack_fffffffffffffde0);
    }
    while (bVar1 = ::operator!=(local_d8), bVar1) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT17(in_stack_fffffffffffffdef,
                                          CONCAT16(in_stack_fffffffffffffdee,
                                                   CONCAT24(in_stack_fffffffffffffdec,
                                                            in_stack_fffffffffffffde8))),
                         (size_t)in_stack_fffffffffffffde0);
      in_stack_fffffffffffffe38 = (char *)QVar2.m_size;
      QVar2.m_data = (char *)in_stack_fffffffffffffdf8;
      QVar2.m_size = (qsizetype)in_stack_fffffffffffffdf0;
      QString::operator+=((QString *)in_stack_fffffffffffffdd8,QVar2);
      QStringTokenizerBase<QStringView,_QChar>::iterator::operator++(in_stack_fffffffffffffde0);
    }
    bVar1 = ::operator!=(local_110);
    if (bVar1) {
      while (bVar1 = ::operator!=(local_110), bVar1) {
        QStringTokenizerBase<QStringView,_QChar>::iterator::operator++
                  (in_stack_fffffffffffffdf0,
                   CONCAT13(in_stack_fffffffffffffdef,
                            CONCAT12(in_stack_fffffffffffffdee,in_stack_fffffffffffffdec)));
        in_stack_fffffffffffffde0 =
             (iterator *)
             QStringTokenizerBase<QStringView,_QChar>::iterator::operator*((iterator *)0x27e0e6);
        local_148 = in_stack_fffffffffffffde0->tokenizer;
        psStack_140 = (storage_type_conflict *)(in_stack_fffffffffffffde0->current).value.m_size;
        v.m_data = (storage_type_conflict *)in_stack_fffffffffffffdf8;
        v.m_size = (qsizetype)in_stack_fffffffffffffdf0;
        QString::operator+=((QString *)in_stack_fffffffffffffdd8,v);
        QChar::QChar<char16_t,_true>(local_182,L'/');
        c.ucs._1_1_ = in_stack_fffffffffffffdef;
        c.ucs._0_1_ = in_stack_fffffffffffffdee;
        QString::operator+=((QString *)in_stack_fffffffffffffde0,c);
      }
      QString::chop((QString *)in_stack_fffffffffffffde0,(qsizetype)in_stack_fffffffffffffdd8);
    }
    bVar1 = QString::isEmpty((QString *)0x27e161);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT17(in_stack_fffffffffffffdef,
                                  CONCAT16(in_stack_fffffffffffffdee,
                                           CONCAT24(in_stack_fffffffffffffdec,
                                                    in_stack_fffffffffffffde8))),
                 (size_t)in_stack_fffffffffffffde0);
      other.m_data = in_stack_fffffffffffffe38;
      other.m_size = in_stack_fffffffffffffe30;
      QString::operator=(this_00,other);
    }
  }
  QString::~QString((QString *)0x27e1c7);
  QString::~QString((QString *)0x27e1d4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QDir::relativeFilePath(const QString &fileName) const
{
    QString dir = cleanPath(absolutePath());
    QString file = cleanPath(fileName);

    if (isRelativePath(file) || isRelativePath(dir))
        return file;

#ifdef Q_OS_WIN
    QString dirDrive = driveSpec(dir);
    QString fileDrive = driveSpec(file);

    bool fileDriveMissing = false;
    if (fileDrive.isEmpty()) {
        fileDrive = dirDrive;
        fileDriveMissing = true;
    }

    if (fileDrive.toLower() != dirDrive.toLower()
            || (file.startsWith("//"_L1)
                && !dir.startsWith("//"_L1))) {
        return file;
    }

    dir.remove(0, dirDrive.size());
    if (!fileDriveMissing)
        file.remove(0, fileDrive.size());
#endif

    QString result;
    const auto dirElts = dir.tokenize(u'/', Qt::SkipEmptyParts);
    const auto fileElts = file.tokenize(u'/', Qt::SkipEmptyParts);

    const auto dend = dirElts.end();
    const auto fend = fileElts.end();
    auto dit = dirElts.begin();
    auto fit = fileElts.begin();

    const auto eq = [](QStringView lhs, QStringView rhs) {
        return
#if defined(Q_OS_WIN)
           lhs.compare(rhs, Qt::CaseInsensitive) == 0;
#else
           lhs == rhs;
#endif
    };

    // std::ranges::mismatch
    while (dit != dend && fit != fend && eq(*dit, *fit)) {
        ++dit;
        ++fit;
    }

    while (dit != dend) {
        result += "../"_L1;
        ++dit;
    }

    if (fit != fend) {
        while (fit != fend) {
            result += *fit++;
            result += u'/';
        }
        result.chop(1);
    }

    if (result.isEmpty())
        result = "."_L1;
    return result;
}